

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O1

float Imath_2_5::angle4D<float>(Quat<float> *q1,Quat<float> *q2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar1 = q1->r - q2->r;
  fVar2 = (q1->v).x - (q2->v).x;
  fVar3 = (q1->v).y - (q2->v).y;
  fVar4 = (q1->v).z - (q2->v).z;
  fVar1 = fVar1 * fVar1 + fVar4 * fVar4 + fVar2 * fVar2 + fVar3 * fVar3;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar2 = q1->r + q2->r;
  fVar3 = (q1->v).x + (q2->v).x;
  fVar4 = (q1->v).y + (q2->v).y;
  fVar5 = (q1->v).z + (q2->v).z;
  fVar2 = fVar2 * fVar2 + fVar5 * fVar5 + fVar3 * fVar3 + fVar4 * fVar4;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar1 = atan2f(fVar1,fVar2);
  return fVar1 + fVar1;
}

Assistant:

T
angle4D (const Quat<T> &q1, const Quat<T> &q2)
{
    //
    // Compute the angle between two quaternions,
    // interpreting the quaternions as 4D vectors.
    //

    Quat<T> d = q1 - q2;
    T lengthD = Math<T>::sqrt (d ^ d);

    Quat<T> s = q1 + q2;
    T lengthS = Math<T>::sqrt (s ^ s);

    return 2 * Math<T>::atan2 (lengthD, lengthS);
}